

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus.c
# Opt level: O0

void resume_all_vcpus_sparc64(uc_struct_conflict9 *uc)

{
  CPUState *cpu_00;
  int iVar1;
  CPUState *cpu;
  uc_struct_conflict9 *uc_local;
  
  cpu_00 = uc->cpu;
  cpu_00->halted = 0;
  cpu_00->exit_request = false;
  cpu_00->exception_index = -1;
  cpu_resume_sparc64(cpu_00);
  cpu_00->created = true;
  do {
    iVar1 = tcg_cpu_exec(uc);
  } while (iVar1 == 0);
  if (uc->use_exits == 0) {
    uc_exit_invalidate_iter(uc->exits + (uc->nested_level + -1),(gpointer)0x0,uc);
  }
  else {
    g_tree_foreach(uc->ctl_exits,uc_exit_invalidate_iter,uc);
  }
  cpu_00->created = false;
  return;
}

Assistant:

void resume_all_vcpus(struct uc_struct* uc)
{
    CPUState *cpu = uc->cpu;
    cpu->halted = 0;
    cpu->exit_request = 0;
    cpu->exception_index = -1;
    cpu_resume(cpu);
    /* static void qemu_tcg_cpu_loop(struct uc_struct *uc) */
    cpu->created = true;
    while (true) {
        if (tcg_cpu_exec(uc)) {
            break;
        }
    }

    // clear the cache of the exits address, since the generated code
    // at that address is to exit emulation, but not for the instruction there.
    // if we dont do this, next time we cannot emulate at that address
    if (uc->use_exits) {
        g_tree_foreach(uc->ctl_exits, uc_exit_invalidate_iter, (void*)uc);
    } else {
        uc_exit_invalidate_iter((gpointer)&uc->exits[uc->nested_level - 1], NULL, (gpointer)uc);
    }

    cpu->created = false;
}